

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

put_transaction<unsigned_short> * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_emplace<unsigned_short,unsigned_short>
          (put_transaction<unsigned_short> *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this,
          unsigned_short *i_construction_params)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_90;
  put_transaction<unsigned_short> local_80;
  put_transaction<unsigned_short> local_68;
  put_transaction<unsigned_short> local_50;
  
  local_90._M_owns = false;
  local_90._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_90);
  local_90._M_owns = true;
  local_68.m_put_data =
       heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
       inplace_allocate<0ul,true,2ul,2ul>
                 ((heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
                  (this + 0x28));
  local_68.m_put_data.m_control_block[1].m_next =
       (uintptr_t)
       detail::
       FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,unsigned_short>
       ::s_table;
  *(unsigned_short *)local_68.m_put_data.m_user_storage = *i_construction_params;
  local_68.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  local_80.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       (this + 0x28);
  local_80.m_put_data = local_68.m_put_data;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_68);
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::put_transaction(&local_50,0,&local_90,&local_80);
  (__return_storage_ptr__->m_lock)._M_device = local_50.m_lock._M_device;
  (__return_storage_ptr__->m_lock)._M_owns = local_50.m_lock._M_owns;
  local_50.m_lock._M_device = (mutex_type *)0x0;
  local_50.m_lock._M_owns = false;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_50.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_50.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_50.m_put_transaction.m_put_data.m_user_storage;
  local_50.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_50);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<unsigned_short>::~put_transaction(&local_80);
  std::unique_lock<std::mutex>::~unique_lock(&local_90);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            return put_transaction<ELEMENT_TYPE>(
              PrivateType(),
              std::move(lock),
              m_queue.template start_emplace<ELEMENT_TYPE>(
                std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...));
        }